

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropulsionSystem.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::PropulsionSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,PropulsionSystem *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Propulsion System:",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tPower Setting:  ",0x12);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32PowerSetting);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tEngine RPM:     ",0x12);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32EngineRPM);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString PropulsionSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Propulsion System:"
       << "\n\tPower Setting:  " << m_f32PowerSetting
       << "\n\tEngine RPM:     " << m_f32EngineRPM
       << "\n";

    return ss.str();
}